

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_get_display_window(exr_const_context_t_conflict ctxt,int part_index,exr_attr_box2i_t *out)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  exr_const_context_t_conflict in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_const_priv_part_t part;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_RDX);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_RDX);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RDX == (exr_const_context_t_conflict)0x0) {
        if (*in_RDI == '\x01') {
          internal_exr_unlock((exr_const_context_t_conflict)0x0);
        }
        local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,3,"NULL output for \'%s\'","displayWindow");
      }
      else if (*(long *)(lVar1 + 0x38) == 0) {
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_RDX);
        }
        local_4 = 0xf;
      }
      else if (*(int *)(*(long *)(lVar1 + 0x38) + 0x14) == 1) {
        puVar2 = *(undefined8 **)(*(long *)(lVar1 + 0x38) + 0x18);
        uVar3 = *puVar2;
        in_RDX->mode = (char)uVar3;
        in_RDX->version = (char)((ulong)uVar3 >> 8);
        in_RDX->max_name_length = (char)((ulong)uVar3 >> 0x10);
        in_RDX->is_singlepart_tiled = (char)((ulong)uVar3 >> 0x18);
        in_RDX->has_nonimage_data = (char)((ulong)uVar3 >> 0x20);
        in_RDX->is_multipart = (char)((ulong)uVar3 >> 0x28);
        in_RDX->strict_header = (char)((ulong)uVar3 >> 0x30);
        in_RDX->silent_header = (char)((ulong)uVar3 >> 0x38);
        uVar3 = puVar2[1];
        (in_RDX->filename).length = (int)uVar3;
        (in_RDX->filename).alloc_size = (int)((ulong)uVar3 >> 0x20);
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_RDX);
        }
        local_4 = 0;
      }
      else {
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_RDX);
        }
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)(*(long *)(lVar1 + 0x38) + 8),"displayWindow");
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_display_window (
    exr_const_context_t ctxt, int part_index, exr_attr_box2i_t* out)
{
    REQ_ATTR_GET_IMPL_DEREF (displayWindow, box2i, EXR_ATTR_BOX2I);
}